

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_set<Level>
          (App *this,string *name,Level *member,
          set<Level,_std::less<Level>,_std::allocator<Level>_> *options,string *description)

{
  reference pvVar1;
  Option *this_00;
  string *description_00;
  allocator local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string typeval;
  string local_170 [32];
  string local_150;
  undefined1 local_130 [32];
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_b0;
  string local_90;
  callback_t fun;
  string simple_name;
  
  detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&typeval,name,',');
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&typeval,0);
  ::std::__cxx11::string::string((string *)&simple_name,(string *)pvVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&typeval);
  typeval._M_dataplus._M_p = (pointer)member;
  std::_Rb_tree<Level,_Level,_std::_Identity<Level>,_std::less<Level>,_std::allocator<Level>_>::
  _Rb_tree((_Rb_tree<Level,_Level,_std::_Identity<Level>,_std::less<Level>,_std::allocator<Level>_>
            *)&typeval._M_string_length,&options->_M_t);
  ::std::__cxx11::string::string(local_170,(string *)&simple_name);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_set<Level>(std::__cxx11::string,Level&,std::set<Level,std::less<Level>,std::allocator<Level>>,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)&fun,(anon_class_88_3_1d669d6f *)&typeval);
  add_set<Level>(std::__cxx11::string,Level&,std::set<Level,std::less<Level>,std::allocator<Level>>,std::__cxx11::string)
  ::{lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)#1}::~vector
            ((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>__1_ *)
             &typeval);
  ::std::__cxx11::string::string((string *)&local_90,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_b0,&fun);
  ::std::__cxx11::string::string((string *)&local_d0,(string *)description);
  description_00 = &local_d0;
  this_00 = add_option(this,&local_90,&local_b0,description_00,false);
  ::std::__cxx11::string::~string((string *)&local_d0);
  std::_Function_base::~_Function_base(&local_b0.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::string((string *)&typeval,"TEXT",(allocator *)&local_1c8);
  ::std::__cxx11::string::string((string *)local_130,",",&local_1c9);
  detail::join<std::set<Level,std::less<Level>,std::allocator<Level>>>
            ((string *)(local_130 + 0x20),(detail *)options,
             (set<Level,_std::less<Level>,_std::allocator<Level>_> *)local_130,description_00);
  ::std::operator+(&local_f0," in {",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_130 + 0x20));
  ::std::operator+(&local_1c8,&local_f0,"}");
  ::std::__cxx11::string::append((string *)&typeval);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)(local_130 + 0x20));
  ::std::__cxx11::string::~string((string *)local_130);
  ::std::__cxx11::string::string((string *)&local_150,(string *)&typeval);
  Option::set_custom_option(this_00,&local_150,1);
  ::std::__cxx11::string::~string((string *)&local_150);
  ::std::__cxx11::string::~string((string *)&typeval);
  std::_Function_base::~_Function_base(&fun.super__Function_base);
  ::std::__cxx11::string::~string((string *)&simple_name);
  return this_00;
}

Assistant:

Option *add_set(std::string name,
                    T &member,           ///< The selected member of the set
                    std::set<T> options, ///< The set of possibilities
                    std::string description = "") {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&member, options, simple_name](CLI::results_t res) {
            bool retval = detail::lexical_cast(res[0], member);
            if(!retval)
                throw ConversionError(res[0], simple_name);
            return std::find(std::begin(options), std::end(options), member) != std::end(options);
        };

        Option *opt = add_option(name, fun, description, false);
        std::string typeval = detail::type_name<T>();
        typeval += " in {" + detail::join(options) + "}";
        opt->set_custom_option(typeval);
        return opt;
    }